

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cases.cpp
# Opt level: O1

Clause * __thiscall
Inferences::Cases::performParamodulation(Cases *this,Clause *premise,Literal *lit,TermList t)

{
  uint uVar1;
  TermList arg2;
  Self SVar2;
  int iVar3;
  ulong uVar4;
  Literal **ppLVar5;
  Literal *pLVar6;
  Literal **ppLVar7;
  TermList sort;
  Clause *pCVar8;
  uint uVar9;
  Literal **ppLVar10;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  GeneratingInference1 local_70;
  Inference local_60;
  
  uVar4 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
  pCVar8 = (Clause *)0x0;
  if (((lit->super_Term)._args[uVar4]._content != t._content) &&
     ((lit->super_Term)._args[uVar4 - 1]._content != t._content)) {
    if (performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::troo == '\0') {
      iVar3 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                   ::troo);
      if (iVar3 != 0) {
        performParamodulation::troo._content = (uint64_t)Kernel::Term::foolTrue();
        __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                             ::troo);
      }
    }
    if (performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::fols == '\0') {
      iVar3 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                   ::fols);
      if (iVar3 != 0) {
        performParamodulation::fols._content = (uint64_t)Kernel::Term::foolFalse();
        __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                             ::fols);
      }
    }
    ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled(&local_80);
    uVar9 = *(uint *)&premise->field_0x38 & 0xfffff;
    if (uVar9 != 0) {
      uVar4 = (ulong)(uVar9 != 0);
      ppLVar5 = premise->_literals;
      ppLVar7 = premise->_literals + uVar4;
      do {
        SVar2._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )local_80._self;
        pLVar6 = *ppLVar5;
        if (pLVar6 == lit) {
          pLVar6 = Kernel::EqHelper::replace(pLVar6,t,performParamodulation::troo);
        }
        if (*(Literal ***)
             ((long)SVar2._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x10) == *(Literal ***)
                       ((long)SVar2._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x18)) {
          ::Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     SVar2._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        }
        **(Literal ***)
          ((long)SVar2._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
             = pLVar6;
        *(Literal ***)
         ((long)SVar2._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
             = *(Literal ***)
                ((long)SVar2._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) + 1;
        uVar1 = (uint)uVar4;
        ppLVar10 = ppLVar7 + 1;
        if (uVar9 <= uVar1) {
          ppLVar7 = (Literal **)0x0;
        }
        uVar4 = (ulong)(uVar1 + 1);
        ppLVar5 = ppLVar7;
        ppLVar7 = ppLVar10;
      } while (uVar1 < uVar9);
    }
    SVar2._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
         local_80._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
    arg2._content = performParamodulation::fols._content;
    sort = Kernel::AtomicSort::boolSort();
    pLVar6 = Kernel::Literal::createEquality(true,t,arg2,sort);
    if (*(Literal ***)
         ((long)SVar2._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
        == *(Literal ***)
            ((long)SVar2._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x18)) {
      ::Lib::Stack<Kernel::Literal_*>::expand
                ((Stack<Kernel::Literal_*> *)
                 SVar2._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
    }
    **(Literal ***)
      ((long)SVar2._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
         pLVar6;
    *(Literal ***)
     ((long)SVar2._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
         *(Literal ***)
          ((long)SVar2._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
         + 1;
    local_70.rule = FOOL_PARAMODULATION;
    local_70.premise = premise;
    Kernel::Inference::Inference(&local_60,&local_70);
    pCVar8 = Kernel::Clause::fromStack
                       ((Stack<Kernel::Literal_*> *)
                        local_80._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                        &local_60);
    ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&local_80);
  }
  return pCVar8;
}

Assistant:

Clause* Cases::performParamodulation(Clause* premise, Literal* lit, TermList t) {
  ASS(t.isTerm());

  TermList lhs = *lit->nthArgument(0);
  TermList rhs = *lit->nthArgument(1);

  if((t == lhs) || (t == rhs)){
    return 0;
  }

  static TermList troo(Term::foolTrue());
  static TermList fols(Term::foolFalse());


  // Found a boolean term! Create the C[true] \/ s = false clause

  RStack<Literal*> resLits;

  // Copy the literals from the premise except for the one at `literalPosition`,
  // that has the occurrence of `booleanTerm` replaced with false
  for (Literal* curr : iterTraits(premise->iterLits())) {
    resLits->push( curr != lit 
        ? curr
        : EqHelper::replace(curr, t, troo));
  }

  // Add s = false to the clause
  resLits->push(Literal::createEquality(true, t, fols, AtomicSort::boolSort()));

  return Clause::fromStack(*resLits, GeneratingInference1(InferenceRule::FOOL_PARAMODULATION, premise));
}